

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonCodec.cc
# Opt level: O3

size_t __thiscall
avro::parsing::JsonDecoder<avro::parsing::SimpleParser<avro::parsing::JsonDecoderHandler>_>::skipMap
          (JsonDecoder<avro::parsing::SimpleParser<avro::parsing::JsonDecoderHandler>_> *this)

{
  SimpleParser<avro::parsing::JsonDecoderHandler>::advance(&this->parser_,sMapStart);
  std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::pop_back
            (&(this->parser_).parsingStack.c);
  SimpleParser<avro::parsing::JsonDecoderHandler>::advance(&this->parser_,sMapEnd);
  json::JsonParser::expectToken(&this->in_,tkObjectStart);
  skipComposite(this);
  return 0;
}

Assistant:

size_t JsonDecoder<P>::skipMap()
{
    parser_.advance(Symbol::sMapStart);
    parser_.pop();
    parser_.advance(Symbol::sMapEnd);
    expect(JsonParser::tkObjectStart);
    skipComposite();
    return 0;
}